

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataPtr xmlNewAutomata(void)

{
  int iVar1;
  xmlRegStatePtr pxVar2;
  xmlAutomataPtr ctxt;
  
  ctxt = xmlRegNewParserCtxt((xmlChar *)0x0);
  if (ctxt == (xmlRegParserCtxtPtr)0x0) {
    ctxt = (xmlAutomataPtr)0x0;
  }
  else {
    ctxt->end = (xmlRegStatePtr)0x0;
    pxVar2 = xmlRegNewState(ctxt);
    ctxt->state = pxVar2;
    ctxt->start = pxVar2;
    if (ctxt->start == (xmlRegStatePtr)0x0) {
      xmlFreeAutomata(ctxt);
      ctxt = (xmlAutomataPtr)0x0;
    }
    else {
      ctxt->start->type = XML_REGEXP_START_STATE;
      iVar1 = xmlRegStatePush(ctxt,ctxt->start);
      if (iVar1 < 0) {
        xmlRegFreeState(ctxt->start);
        xmlFreeAutomata(ctxt);
        ctxt = (xmlAutomataPtr)0x0;
      }
      else {
        ctxt->flags = 0;
      }
    }
  }
  return ctxt;
}

Assistant:

xmlAutomataPtr
xmlNewAutomata(void) {
    xmlAutomataPtr ctxt;

    ctxt = xmlRegNewParserCtxt(NULL);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->end = NULL;
    ctxt->start = ctxt->state = xmlRegNewState(ctxt);
    if (ctxt->start == NULL) {
	xmlFreeAutomata(ctxt);
	return(NULL);
    }
    ctxt->start->type = XML_REGEXP_START_STATE;
    if (xmlRegStatePush(ctxt, ctxt->start) < 0) {
        xmlRegFreeState(ctxt->start);
	xmlFreeAutomata(ctxt);
	return(NULL);
    }
    ctxt->flags = 0;

    return(ctxt);
}